

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

void xmlSchemaAnnotDump(FILE *output,xmlSchemaAnnotPtr annot)

{
  xmlChar *pxVar1;
  xmlChar *content;
  xmlSchemaAnnotPtr annot_local;
  FILE *output_local;
  
  if (annot != (xmlSchemaAnnotPtr)0x0) {
    pxVar1 = xmlNodeGetContent(annot->content);
    if (pxVar1 == (xmlChar *)0x0) {
      fprintf((FILE *)output,"  Annot: empty\n");
    }
    else {
      fprintf((FILE *)output,"  Annot: %s\n",pxVar1);
      (*xmlFree)(pxVar1);
    }
  }
  return;
}

Assistant:

static void
xmlSchemaAnnotDump(FILE * output, xmlSchemaAnnotPtr annot)
{
    xmlChar *content;

    if (annot == NULL)
        return;

    content = xmlNodeGetContent(annot->content);
    if (content != NULL) {
        fprintf(output, "  Annot: %s\n", content);
        xmlFree(content);
    } else
        fprintf(output, "  Annot: empty\n");
}